

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O0

void __thiscall
cmCTestBuildHandler::GenerateXMLFooter
          (cmCTestBuildHandler *this,cmXMLWriter *xml,double elapsed_build_time)

{
  double dVar1;
  double local_d8;
  allocator local_c9;
  string local_c8;
  uint local_a8;
  allocator local_a1;
  string local_a0;
  allocator local_79;
  string local_78;
  allocator local_41;
  string local_40;
  double local_20;
  double elapsed_build_time_local;
  cmXMLWriter *xml_local;
  cmCTestBuildHandler *this_local;
  
  local_20 = elapsed_build_time;
  elapsed_build_time_local = (double)xml;
  xml_local = (cmXMLWriter *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"Log",&local_41);
  cmXMLWriter::StartElement(xml,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  cmXMLWriter::Attribute<char[7]>
            ((cmXMLWriter *)elapsed_build_time_local,"Encoding",(char (*) [7])"base64");
  cmXMLWriter::Attribute<char[9]>
            ((cmXMLWriter *)elapsed_build_time_local,"Compression",(char (*) [9])"bin/gzip");
  cmXMLWriter::EndElement((cmXMLWriter *)elapsed_build_time_local);
  dVar1 = elapsed_build_time_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_78,"EndDateTime",&local_79);
  cmXMLWriter::Element<std::__cxx11::string>((cmXMLWriter *)dVar1,&local_78,&this->EndBuild);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  dVar1 = elapsed_build_time_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a0,"EndBuildTime",&local_a1);
  local_a8 = (uint)(long)this->EndBuildTime;
  cmXMLWriter::Element<unsigned_int>((cmXMLWriter *)dVar1,&local_a0,&local_a8);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  dVar1 = elapsed_build_time_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c8,"ElapsedMinutes",&local_c9);
  local_d8 = (double)(int)(local_20 / 6.0) / 10.0;
  cmXMLWriter::Element<double>((cmXMLWriter *)dVar1,&local_c8,&local_d8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  cmXMLWriter::EndElement((cmXMLWriter *)elapsed_build_time_local);
  cmCTest::EndXML((this->super_cmCTestGenericHandler).CTest,(cmXMLWriter *)elapsed_build_time_local)
  ;
  return;
}

Assistant:

void cmCTestBuildHandler::GenerateXMLFooter(cmXMLWriter& xml,
                                            double elapsed_build_time)
{
  xml.StartElement("Log");
  xml.Attribute("Encoding", "base64");
  xml.Attribute("Compression", "bin/gzip");
  xml.EndElement(); // Log

  xml.Element("EndDateTime", this->EndBuild);
  xml.Element("EndBuildTime", static_cast<unsigned int>(this->EndBuildTime));
  xml.Element("ElapsedMinutes", static_cast<int>(elapsed_build_time/6)/10.0);
  xml.EndElement(); // Build
  this->CTest->EndXML(xml);
}